

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612_Emu.cpp
# Opt level: O1

void ym2612_update_chan<5>::func(tables_t *g,channel_t *ch,sample_t_conflict1 *buf,int length)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined4 uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  undefined1 auVar25 [16];
  int local_ec;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  uint local_90;
  uint local_8c;
  
  if (ch->SLOT[2].Ecnt != 0x20000000 ||
      (ch->SLOT[1].Ecnt != 0x20000000 || ch->SLOT[3].Ecnt != 0x20000000)) {
    iVar1 = g->LFOinc;
    iVar23 = ch->SLOT[3].Fcnt;
    iVar16 = ch->SLOT[1].Fcnt;
    iVar17 = ch->SLOT[2].Fcnt;
    iVar18 = ch->SLOT[0].Fcnt;
    local_d8 = ch->SLOT[0].Ecnt;
    local_dc = ch->SLOT[2].Ecnt;
    local_e0 = ch->SLOT[1].Ecnt;
    local_e4 = ch->SLOT[3].Ecnt;
    local_9c = ch->SLOT[0].Ecmp;
    local_98 = ch->SLOT[0].Einc;
    uVar14 = g->LFOcnt;
    local_ac = ch->SLOT[1].Ecmp;
    local_a0 = ch->SLOT[1].Einc;
    local_b0 = ch->SLOT[2].Ecmp;
    local_a4 = ch->SLOT[2].Einc;
    local_b4 = ch->SLOT[3].Ecmp;
    local_a8 = ch->SLOT[3].Einc;
    local_c8 = ch->SLOT[0].env_xor;
    local_b8 = ch->SLOT[0].env_max;
    local_cc = ch->SLOT[2].env_xor;
    local_bc = ch->SLOT[2].env_max;
    local_d0 = ch->SLOT[1].env_xor;
    local_c0 = ch->SLOT[1].env_max;
    local_d4 = ch->SLOT[3].env_xor;
    local_c4 = ch->SLOT[3].env_max;
    local_94 = ch->SLOT[0].Ecurp;
    local_8c = ch->SLOT[0].SEG;
    iVar20 = ch->SLOT[1].Ecurp;
    local_90 = ch->SLOT[1].SEG;
    iVar21 = ch->SLOT[2].Ecurp;
    uVar24 = ch->SLOT[2].SEG;
    local_ec = ch->SLOT[3].Ecurp;
    uVar10 = ch->SLOT[3].SEG;
    lVar13 = 0;
    iVar4 = ch->S0_OUT[0];
    iVar5 = ch->S0_OUT[1];
    do {
      iVar11 = iVar4;
      uVar14 = uVar14 + iVar1;
      uVar12 = (ulong)(uVar14 >> 0x11 & 0x7fe);
      iVar19 = (int)*(short *)((long)g->LFO_ENV_TAB + uVar12);
      uVar15 = (int)g->ENV_TAB[local_d8 >> 0x10] + ch->SLOT[0].TLL;
      iVar4 = (iVar19 >> ((byte)ch->SLOT[0].AMS & 0x1f)) + (uVar15 ^ local_c8);
      if (local_b8 <= (int)uVar15) {
        iVar4 = 0;
      }
      uVar15 = (int)g->ENV_TAB[local_dc >> 0x10] + ch->SLOT[2].TLL;
      iVar2 = (iVar19 >> ((byte)ch->SLOT[2].AMS & 0x1f)) + (uVar15 ^ local_cc);
      if (local_bc <= (int)uVar15) {
        iVar2 = 0;
      }
      uVar15 = (int)g->ENV_TAB[local_e0 >> 0x10] + ch->SLOT[1].TLL;
      iVar3 = (iVar19 >> ((byte)ch->SLOT[1].AMS & 0x1f)) + (uVar15 ^ local_d0);
      if (local_c0 <= (int)uVar15) {
        iVar3 = 0;
      }
      uVar15 = (int)g->ENV_TAB[local_e4 >> 0x10] + ch->SLOT[3].TLL;
      iVar19 = (iVar19 >> ((byte)ch->SLOT[3].AMS & 0x1f)) + (uVar15 ^ local_d4);
      if (local_c4 <= (int)uVar15) {
        iVar19 = 0;
      }
      iVar2 = g->TL_TAB[(long)iVar2 +
                        (long)*(short *)((long)g->SIN_TAB +
                                        (ulong)((uint)(iVar11 + iVar17) >> 0xd & 0x1ffe))];
      iVar19 = g->TL_TAB[(long)iVar19 +
                         (long)*(short *)((long)g->SIN_TAB +
                                         (ulong)((uint)(iVar11 + iVar23) >> 0xd & 0x1ffe))];
      iVar3 = g->TL_TAB[(long)iVar3 +
                        (long)*(short *)((long)g->SIN_TAB +
                                        (ulong)((uint)(iVar11 + iVar16) >> 0xd & 0x1ffe))];
      iVar4 = g->TL_TAB[(long)iVar4 +
                        (long)*(short *)((long)g->SIN_TAB +
                                        (ulong)((uint)((iVar5 + iVar11 >> ((byte)ch->FB & 0x1f)) +
                                                      iVar18) >> 0xd & 0x1ffe))];
      iVar22 = ((int)*(short *)((long)g->LFO_FREQ_TAB + uVar12) * ch->FMS >> 10) + 0x100;
      iVar5 = ch->SLOT[0].Finc;
      iVar6 = ch->SLOT[2].Finc;
      iVar7 = ch->SLOT[1].Finc;
      iVar8 = ch->SLOT[3].Finc;
      uVar12._0_4_ = ch->LEFT;
      uVar12._4_4_ = ch->RIGHT;
      uVar9 = *(undefined4 *)(buf + lVar13 * 2);
      local_d8 = local_d8 + local_98;
      ch->SLOT[0].Ecnt = local_d8;
      if (local_d8 < local_9c) goto switchD_006c7abc_default;
      switch(local_94) {
      case 0:
        local_9c = ch->SLOT[0].SLL;
        local_98 = ch->SLOT[0].EincD;
        ch->SLOT[0].Einc = local_98;
        ch->SLOT[0].Ecmp = local_9c;
        ch->SLOT[0].Ecurp = 1;
        ch->SLOT[0].Ecnt = 0x10000000;
        local_d8 = 0x10000000;
        local_94 = 1;
        break;
      case 1:
        local_d8 = ch->SLOT[0].SLL;
        local_98 = ch->SLOT[0].EincS;
        ch->SLOT[0].Ecnt = local_d8;
        ch->SLOT[0].Einc = local_98;
        ch->SLOT[0].Ecmp = 0x20000000;
        ch->SLOT[0].Ecurp = 2;
        local_9c = 0x20000000;
        local_94 = 2;
        break;
      case 2:
        if ((local_8c & 8) != 0) {
          if ((local_8c & 1) == 0) {
            local_98 = ch->SLOT[0].EincA;
            ch->SLOT[0].Einc = local_98;
            ch->SLOT[0].Ecmp = 0x10000000;
            ch->SLOT[0].Ecurp = 0;
            ch->SLOT[0].Ecnt = 0;
            local_94 = 0;
            ch->SLOT[0].env_xor = 0;
            ch->SLOT[0].env_max = 0x7fffffff;
            local_9c = 0x10000000;
            local_b8 = 0x7fffffff;
            local_8c = local_8c * 2 & 4;
            ch->SLOT[0].SEG = local_8c;
            if (local_8c == 0) {
              local_c8 = 0;
            }
            else {
              ch->SLOT[0].env_xor = 0xfff;
              ch->SLOT[0].env_max = 0xfff;
              local_b8 = 0xfff;
              local_c8 = 0xfff;
            }
            local_d8 = 0;
            break;
          }
          ch->SLOT[0].env_xor = 0;
          ch->SLOT[0].env_max = 0x7fffffff;
          local_8c = local_8c * 2 & 4;
          ch->SLOT[0].SEG = local_8c;
          if (local_8c == 0) {
            local_c8 = 0;
            local_b8 = 0x7fffffff;
          }
          else {
            ch->SLOT[0].env_xor = 0xfff;
            ch->SLOT[0].env_max = 0xfff;
            local_b8 = 0xfff;
            local_c8 = 0xfff;
          }
        }
        goto LAB_006c7b21;
      case 3:
LAB_006c7b21:
        ch->SLOT[0].Ecnt = 0x20000000;
        ch->SLOT[0].Einc = 0;
        ch->SLOT[0].Ecmp = 0x20000001;
        local_d8 = 0x20000000;
        local_9c = 0x20000001;
        local_98 = 0;
      }
switchD_006c7abc_default:
      local_e0 = local_e0 + local_a0;
      ch->SLOT[1].Ecnt = local_e0;
      if (local_ac <= local_e0) {
        switch(iVar20) {
        case 0:
          local_ac = ch->SLOT[1].SLL;
          local_a0 = ch->SLOT[1].EincD;
          ch->SLOT[1].Einc = local_a0;
          ch->SLOT[1].Ecmp = local_ac;
          ch->SLOT[1].Ecurp = 1;
          ch->SLOT[1].Ecnt = 0x10000000;
          local_e0 = 0x10000000;
          iVar20 = 1;
          break;
        case 1:
          local_e0 = ch->SLOT[1].SLL;
          local_a0 = ch->SLOT[1].EincS;
          ch->SLOT[1].Ecnt = local_e0;
          ch->SLOT[1].Einc = local_a0;
          ch->SLOT[1].Ecmp = 0x20000000;
          ch->SLOT[1].Ecurp = 2;
          local_ac = 0x20000000;
          iVar20 = 2;
          break;
        case 2:
          if ((local_90 & 8) != 0) {
            if ((local_90 & 1) == 0) {
              local_a0 = ch->SLOT[1].EincA;
              ch->SLOT[1].Einc = local_a0;
              ch->SLOT[1].Ecmp = 0x10000000;
              ch->SLOT[1].Ecurp = 0;
              ch->SLOT[1].Ecnt = 0;
              iVar20 = 0;
              ch->SLOT[1].env_xor = 0;
              ch->SLOT[1].env_max = 0x7fffffff;
              local_ac = 0x10000000;
              local_c0 = 0x7fffffff;
              local_90 = local_90 * 2 & 4;
              ch->SLOT[1].SEG = local_90;
              if (local_90 == 0) {
                local_d0 = 0;
              }
              else {
                ch->SLOT[1].env_xor = 0xfff;
                ch->SLOT[1].env_max = 0xfff;
                local_c0 = 0xfff;
                local_d0 = 0xfff;
              }
              local_e0 = 0;
              break;
            }
            ch->SLOT[1].env_xor = 0;
            ch->SLOT[1].env_max = 0x7fffffff;
            local_90 = local_90 * 2 & 4;
            ch->SLOT[1].SEG = local_90;
            if (local_90 == 0) {
              local_d0 = 0;
              local_c0 = 0x7fffffff;
            }
            else {
              ch->SLOT[1].env_xor = 0xfff;
              ch->SLOT[1].env_max = 0xfff;
              local_c0 = 0xfff;
              local_d0 = 0xfff;
            }
          }
        case 3:
          ch->SLOT[1].Ecnt = 0x20000000;
          ch->SLOT[1].Einc = 0;
          ch->SLOT[1].Ecmp = 0x20000001;
          local_e0 = 0x20000000;
          local_ac = 0x20000001;
          local_a0 = 0;
        }
      }
      local_dc = local_dc + local_a4;
      ch->SLOT[2].Ecnt = local_dc;
      if (local_b0 <= local_dc) {
        switch(iVar21) {
        case 0:
          local_b0 = ch->SLOT[2].SLL;
          local_a4 = ch->SLOT[2].EincD;
          ch->SLOT[2].Einc = local_a4;
          ch->SLOT[2].Ecmp = local_b0;
          ch->SLOT[2].Ecurp = 1;
          ch->SLOT[2].Ecnt = 0x10000000;
          local_dc = 0x10000000;
          iVar21 = 1;
          break;
        case 1:
          local_dc = ch->SLOT[2].SLL;
          local_a4 = ch->SLOT[2].EincS;
          ch->SLOT[2].Ecnt = local_dc;
          ch->SLOT[2].Einc = local_a4;
          ch->SLOT[2].Ecmp = 0x20000000;
          ch->SLOT[2].Ecurp = 2;
          local_b0 = 0x20000000;
          iVar21 = 2;
          break;
        case 2:
          if ((uVar24 & 8) != 0) {
            if ((uVar24 & 1) == 0) {
              local_a4 = ch->SLOT[2].EincA;
              ch->SLOT[2].Einc = local_a4;
              ch->SLOT[2].Ecmp = 0x10000000;
              ch->SLOT[2].Ecurp = 0;
              ch->SLOT[2].Ecnt = 0;
              iVar21 = 0;
              ch->SLOT[2].env_xor = 0;
              ch->SLOT[2].env_max = 0x7fffffff;
              local_b0 = 0x10000000;
              local_bc = 0x7fffffff;
              uVar24 = uVar24 * 2 & 4;
              ch->SLOT[2].SEG = uVar24;
              if (uVar24 == 0) {
                local_cc = 0;
              }
              else {
                ch->SLOT[2].env_xor = 0xfff;
                ch->SLOT[2].env_max = 0xfff;
                local_bc = 0xfff;
                local_cc = 0xfff;
              }
              local_dc = 0;
              break;
            }
            ch->SLOT[2].env_xor = 0;
            ch->SLOT[2].env_max = 0x7fffffff;
            uVar24 = uVar24 * 2 & 4;
            ch->SLOT[2].SEG = uVar24;
            if (uVar24 == 0) {
              local_cc = 0;
              local_bc = 0x7fffffff;
            }
            else {
              ch->SLOT[2].env_xor = 0xfff;
              ch->SLOT[2].env_max = 0xfff;
              local_bc = 0xfff;
              local_cc = 0xfff;
            }
          }
        case 3:
          ch->SLOT[2].Ecnt = 0x20000000;
          ch->SLOT[2].Einc = 0;
          ch->SLOT[2].Ecmp = 0x20000001;
          local_dc = 0x20000000;
          local_b0 = 0x20000001;
          local_a4 = 0;
        }
      }
      iVar19 = iVar2 + iVar19 + iVar3 >> 0x10;
      local_e4 = local_e4 + local_a8;
      ch->SLOT[3].Ecnt = local_e4;
      if (local_b4 <= local_e4) {
        switch(local_ec) {
        case 0:
          local_b4 = ch->SLOT[3].SLL;
          local_a8 = ch->SLOT[3].EincD;
          ch->SLOT[3].Einc = local_a8;
          ch->SLOT[3].Ecmp = local_b4;
          ch->SLOT[3].Ecurp = 1;
          ch->SLOT[3].Ecnt = 0x10000000;
          local_e4 = 0x10000000;
          local_ec = 1;
          break;
        case 1:
          local_e4 = ch->SLOT[3].SLL;
          local_a8 = ch->SLOT[3].EincS;
          ch->SLOT[3].Ecnt = local_e4;
          ch->SLOT[3].Einc = local_a8;
          ch->SLOT[3].Ecmp = 0x20000000;
          ch->SLOT[3].Ecurp = 2;
          local_b4 = 0x20000000;
          local_ec = 2;
          break;
        case 2:
          if ((uVar10 & 8) != 0) {
            if ((uVar10 & 1) == 0) {
              local_a8 = ch->SLOT[3].EincA;
              ch->SLOT[3].Einc = local_a8;
              ch->SLOT[3].Ecmp = 0x10000000;
              ch->SLOT[3].Ecurp = 0;
              ch->SLOT[3].Ecnt = 0;
              local_ec = 0;
              ch->SLOT[3].env_xor = 0;
              ch->SLOT[3].env_max = 0x7fffffff;
              local_b4 = 0x10000000;
              local_c4 = 0x7fffffff;
              uVar10 = uVar10 * 2 & 4;
              ch->SLOT[3].SEG = uVar10;
              if (uVar10 == 0) {
                local_d4 = 0;
              }
              else {
                ch->SLOT[3].env_xor = 0xfff;
                ch->SLOT[3].env_max = 0xfff;
                local_c4 = 0xfff;
                local_d4 = 0xfff;
              }
              local_e4 = 0;
              break;
            }
            ch->SLOT[3].env_xor = 0;
            ch->SLOT[3].env_max = 0x7fffffff;
            uVar10 = uVar10 * 2 & 4;
            ch->SLOT[3].SEG = uVar10;
            if (uVar10 == 0) {
              local_d4 = 0;
              local_c4 = 0x7fffffff;
            }
            else {
              ch->SLOT[3].env_xor = 0xfff;
              ch->SLOT[3].env_max = 0xfff;
              local_c4 = 0xfff;
              local_d4 = 0xfff;
            }
          }
        case 3:
          ch->SLOT[3].Ecnt = 0x20000000;
          ch->SLOT[3].Einc = 0;
          ch->SLOT[3].Ecmp = 0x20000001;
          local_e4 = 0x20000000;
          local_b4 = 0x20000001;
          local_a8 = 0;
        }
      }
      iVar18 = ((uint)(iVar5 * iVar22) >> 8) + iVar18;
      iVar17 = ((uint)(iVar6 * iVar22) >> 8) + iVar17;
      iVar16 = ((uint)(iVar7 * iVar22) >> 8) + iVar16;
      iVar23 = ((uint)(iVar22 * iVar8) >> 8) + iVar23;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = uVar12 & CONCAT44(iVar19,iVar19);
      ch->S0_OUT[0] = iVar4;
      auVar25 = pshuflw(auVar25,auVar25,0xe8);
      *(uint *)(buf + lVar13 * 2) =
           CONCAT22((short)((uint)uVar9 >> 0x10) + auVar25._2_2_,(short)uVar9 + auVar25._0_2_);
      lVar13 = lVar13 + 1;
      iVar5 = iVar11;
    } while (length != (int)lVar13);
    ch->S0_OUT[1] = iVar11;
    ch->SLOT[0].Fcnt = iVar18;
    ch->SLOT[2].Fcnt = iVar17;
    ch->SLOT[1].Fcnt = iVar16;
    ch->SLOT[3].Fcnt = iVar23;
  }
  return;
}

Assistant:

void ym2612_update_chan<algo>::func( tables_t& g, channel_t& ch,
		Ym2612_Emu::sample_t* buf, int length )
{
	int not_end = ch.SLOT [S3].Ecnt - ENV_END;
	
	// algo is a compile-time constant, so all conditions based on it are resolved
	// during compilation
	
	// special cases
	if ( algo == 7 )
		not_end |= ch.SLOT [S0].Ecnt - ENV_END;
	
	if ( algo >= 5 )
		not_end |= ch.SLOT [S2].Ecnt - ENV_END;
	
	if ( algo >= 4 )
		not_end |= ch.SLOT [S1].Ecnt - ENV_END;
	
	int CH_S0_OUT_1 = ch.S0_OUT [1];
	
	int in0 = ch.SLOT [S0].Fcnt;
	int in1 = ch.SLOT [S1].Fcnt;
	int in2 = ch.SLOT [S2].Fcnt;
	int in3 = ch.SLOT [S3].Fcnt;
	
	int YM2612_LFOinc = g.LFOinc;
	int YM2612_LFOcnt = g.LFOcnt + YM2612_LFOinc;
	
	if ( !not_end )
		return;
	
	do
	{
		// envelope
		int const env_LFO = g.LFO_ENV_TAB [YM2612_LFOcnt >> LFO_LBITS & LFO_MASK];
		
		short const* const ENV_TAB = g.ENV_TAB;
		
	#define CALC_EN( x ) \
		int temp##x = ENV_TAB [ch.SLOT [S##x].Ecnt >> ENV_LBITS] + ch.SLOT [S##x].TLL;  \
		int en##x = ((temp##x ^ ch.SLOT [S##x].env_xor) + (env_LFO >> ch.SLOT [S##x].AMS)) &    \
				((temp##x - ch.SLOT [S##x].env_max) >> 31);
		
		CALC_EN( 0 )
		CALC_EN( 1 )
		CALC_EN( 2 )
		CALC_EN( 3 )
		
		int const* const TL_TAB = g.TL_TAB;
		
	#define SINT( i, o ) (TL_TAB [g.SIN_TAB [(i)] + (o)])
		
		// feedback
		int CH_S0_OUT_0 = ch.S0_OUT [0];
		{
			int temp = in0 + ((CH_S0_OUT_0 + CH_S0_OUT_1) >> ch.FB);
			CH_S0_OUT_1 = CH_S0_OUT_0;
			CH_S0_OUT_0 = SINT( (temp >> SIN_LBITS) & SIN_MASK, en0 );
		}
		
		int CH_OUTd;
		if ( algo == 0 )
		{
			int temp = in1 + CH_S0_OUT_1;
			temp = in2 + SINT( (temp >> SIN_LBITS) & SIN_MASK, en1 );
			temp = in3 + SINT( (temp >> SIN_LBITS) & SIN_MASK, en2 );
			CH_OUTd = SINT( (temp >> SIN_LBITS) & SIN_MASK, en3 );
		}
		else if ( algo == 1 )
		{
			int temp = in2 + CH_S0_OUT_1 + SINT( (in1 >> SIN_LBITS) & SIN_MASK, en1 );
			temp = in3 + SINT( (temp >> SIN_LBITS) & SIN_MASK, en2 );
			CH_OUTd = SINT( (temp >> SIN_LBITS) & SIN_MASK, en3 );
		}
		else if ( algo == 2 )
		{
			int temp = in2 + SINT( (in1 >> SIN_LBITS) & SIN_MASK, en1 );
			temp = in3 + CH_S0_OUT_1 + SINT( (temp >> SIN_LBITS) & SIN_MASK, en2 );
			CH_OUTd = SINT( (temp >> SIN_LBITS) & SIN_MASK, en3 );
		}
		else if ( algo == 3 )
		{
			int temp = in1 + CH_S0_OUT_1;
			temp = in3 + SINT( (temp >> SIN_LBITS) & SIN_MASK, en1 ) +
					SINT( (in2 >> SIN_LBITS) & SIN_MASK, en2 );
			CH_OUTd = SINT( (temp >> SIN_LBITS) & SIN_MASK, en3 );
		}
		else if ( algo == 4 )
		{
			int temp = in3 + SINT( (in2 >> SIN_LBITS) & SIN_MASK, en2 );
			CH_OUTd = SINT( (temp >> SIN_LBITS) & SIN_MASK, en3 ) +
					SINT( ((in1 + CH_S0_OUT_1) >> SIN_LBITS) & SIN_MASK, en1 );
			//DO_LIMIT
		}
		else if ( algo == 5 )
		{
			int temp = CH_S0_OUT_1;
			CH_OUTd = SINT( ((in3 + temp) >> SIN_LBITS) & SIN_MASK, en3 ) +
					SINT( ((in1 + temp) >> SIN_LBITS) & SIN_MASK, en1 ) +
					SINT( ((in2 + temp) >> SIN_LBITS) & SIN_MASK, en2 );
			//DO_LIMIT
		}
		else if ( algo == 6 )
		{
			CH_OUTd = SINT( (in3 >> SIN_LBITS) & SIN_MASK, en3 ) +
					SINT( ((in1 + CH_S0_OUT_1) >> SIN_LBITS) & SIN_MASK, en1 ) +
					SINT( (in2 >> SIN_LBITS) & SIN_MASK, en2 );
			//DO_LIMIT
		}
		else if ( algo == 7 )
		{
			CH_OUTd = SINT( (in3 >> SIN_LBITS) & SIN_MASK, en3 ) +
					SINT( (in1 >> SIN_LBITS) & SIN_MASK, en1 ) +
					SINT( (in2 >> SIN_LBITS) & SIN_MASK, en2 ) + CH_S0_OUT_1;
			//DO_LIMIT
		}
		
		CH_OUTd >>= MAX_OUT_BITS - output_bits + 2;
		
		// update phase
		unsigned freq_LFO = ((g.LFO_FREQ_TAB [YM2612_LFOcnt >> LFO_LBITS & LFO_MASK] *
				ch.FMS) >> (LFO_HBITS - 1 + 1)) + (1L << (LFO_FMS_LBITS - 1));
		YM2612_LFOcnt += YM2612_LFOinc;
		in0 += (ch.SLOT [S0].Finc * freq_LFO) >> (LFO_FMS_LBITS - 1);
		in1 += (ch.SLOT [S1].Finc * freq_LFO) >> (LFO_FMS_LBITS - 1);
		in2 += (ch.SLOT [S2].Finc * freq_LFO) >> (LFO_FMS_LBITS - 1);
		in3 += (ch.SLOT [S3].Finc * freq_LFO) >> (LFO_FMS_LBITS - 1);
		
		int t0 = buf [0] + (CH_OUTd & ch.LEFT);
		int t1 = buf [1] + (CH_OUTd & ch.RIGHT);
		
		update_envelope( ch.SLOT [0] );
		update_envelope( ch.SLOT [1] );
		update_envelope( ch.SLOT [2] );
		update_envelope( ch.SLOT [3] );
		
		ch.S0_OUT [0] = CH_S0_OUT_0;
		buf [0] = t0;
		buf [1] = t1;
		buf += 2;
	}
	while ( --length );
	
	ch.S0_OUT [1] = CH_S0_OUT_1;
	
	ch.SLOT [S0].Fcnt = in0;
	ch.SLOT [S1].Fcnt = in1;
	ch.SLOT [S2].Fcnt = in2;
	ch.SLOT [S3].Fcnt = in3;
}